

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O2

void google::protobuf::anon_unknown_25::ToDuration(uint128 *value,bool negative,Duration *duration)

{
  int iVar1;
  uint64 uVar2;
  undefined7 in_register_00000031;
  uint128 uVar3;
  uint128 uVar4;
  uint128 local_48;
  int local_34;
  
  local_34 = (int)CONCAT71(in_register_00000031,negative);
  local_48.lo_ = 1000000000;
  local_48.hi_ = 0;
  uVar3 = operator/(value,&local_48);
  local_48.lo_ = 1000000000;
  local_48.hi_ = 0;
  uVar4 = operator%(value,&local_48);
  iVar1 = -(int)uVar4.lo_;
  uVar2 = -uVar3.lo_;
  if (local_34 == 0) {
    iVar1 = (int)uVar4.lo_;
    uVar2 = uVar3.lo_;
  }
  duration->seconds_ = uVar2;
  duration->nanos_ = iVar1;
  return;
}

Assistant:

void ToDuration(const uint128& value, bool negative, Duration* duration) {
  int64 seconds =
      static_cast<int64>(Uint128Low64(value / kNanosPerSecond));
  int32 nanos = static_cast<int32>(Uint128Low64(value % kNanosPerSecond));
  if (negative) {
    seconds = -seconds;
    nanos = -nanos;
  }
  duration->set_seconds(seconds);
  duration->set_nanos(nanos);
}